

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

void __thiscall
pstore::sparse_array<int,unsigned_short>::
sparse_array<std::_Rb_tree_const_iterator<unsigned_long>,int_const*>
          (sparse_array<int,unsigned_short> *this,_Rb_tree_const_iterator<unsigned_long> first_index
          ,_Rb_tree_const_iterator<unsigned_long> last_index,int *first_value,int *last_value)

{
  bool bVar1;
  unsigned_short uVar2;
  sparse_array<int,unsigned_short> *local_48;
  int *out;
  int *last_value_local;
  int *first_value_local;
  sparse_array<int,_unsigned_short> *this_local;
  _Rb_tree_const_iterator<unsigned_long> last_index_local;
  _Rb_tree_const_iterator<unsigned_long> first_index_local;
  
  this_local = (sparse_array<int,_unsigned_short> *)last_index._M_node;
  last_index_local = first_index;
  uVar2 = bitmap<std::_Rb_tree_const_iterator<unsigned_long>,void>(first_index,last_index);
  *(unsigned_short *)this = uVar2;
  bVar1 = std::operator!=(&last_index_local,(_Self *)&this_local);
  last_value_local = first_value;
  if (bVar1) {
    if (first_value != last_value) {
      last_value_local = first_value + 1;
      *(int *)(this + 4) = *first_value;
    }
    std::_Rb_tree_const_iterator<unsigned_long>::operator++(&last_index_local);
  }
  local_48 = this + 8;
  for (; bVar1 = std::operator!=(&last_index_local,(_Self *)&this_local),
      bVar1 && last_value_local != last_value; last_value_local = last_value_local + 1) {
    *(int *)local_48 = *last_value_local;
    std::_Rb_tree_const_iterator<unsigned_long>::operator++(&last_index_local);
    local_48 = local_48 + 4;
  }
  while (bVar1 = std::operator!=(&last_index_local,(_Self *)&this_local), bVar1) {
    *(undefined4 *)local_48 = 0;
    std::_Rb_tree_const_iterator<unsigned_long>::operator++(&last_index_local);
    local_48 = local_48 + 4;
  }
  return;
}

Assistant:

sparse_array<ValueType, BitmapType>::sparse_array (IteratorIdx first_index,
                                                       IteratorIdx last_index,
                                                       IteratorV first_value, IteratorV last_value)
            : bitmap_{bitmap (first_index, last_index)} {

        // Deal with the first element. This is the odd-one-out becuase it's in the
        // declaration of the object and will have been default-constructed by the
        // compiler.
        if (first_index != last_index) {
            if (first_value != last_value) {
                elements_[0] = *(first_value++);
            }
            ++first_index;
        }

        auto out = &elements_[1];

        // Now construct any remaining elements into the uninitialized memory past the
        // end of the object using placement new.
        for (; first_index != last_index && first_value != last_value;
             ++first_index, ++first_value, ++out) {
            new (out) ValueType (*first_value);
        }
        // Default-construct any remaining objects for which we don't have a value.
        for (; first_index != last_index; ++first_index, ++out) {
            new (out) ValueType ();
        }
    }